

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O2

void lyb_skip_siblings(lylyb_ctx *lybctx)

{
  long lVar1;
  lyd_lyb_sibling *plVar2;
  long lVar3;
  
  plVar2 = lybctx->siblings;
  lVar1 = -1;
  do {
    lVar3 = lVar1;
    if (plVar2 != (lyd_lyb_sibling *)0x0) {
      lVar3 = *(long *)&plVar2[-1].inner_chunks + -1;
    }
    ly_in_skip(lybctx->in,(ulong)plVar2[lVar3].inner_chunks << 2);
    plVar2 = lybctx->siblings;
    lVar3 = lVar1;
    if (plVar2 != (lyd_lyb_sibling *)0x0) {
      lVar3 = *(long *)&plVar2[-1].inner_chunks + -1;
    }
    lyb_read((uint8_t *)0x0,plVar2[lVar3].written,lybctx);
    plVar2 = lybctx->siblings;
    lVar3 = lVar1;
    if (plVar2 != (lyd_lyb_sibling *)0x0) {
      lVar3 = *(long *)&plVar2[-1].inner_chunks + -1;
    }
  } while (plVar2[lVar3].written != 0);
  return;
}

Assistant:

static void
lyb_skip_siblings(struct lylyb_ctx *lybctx)
{
    do {
        /* first skip any meta information inside */
        ly_in_skip(lybctx->in, LYB_LAST_SIBLING(lybctx).inner_chunks * LYB_META_BYTES);

        /* then read data */
        lyb_read(NULL, LYB_LAST_SIBLING(lybctx).written, lybctx);
    } while (LYB_LAST_SIBLING(lybctx).written);
}